

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O2

uint64_t vfio_map_dma(void *vaddr,uint32_t size)

{
  int iVar1;
  int *piVar2;
  vfio_iommu_type1_dma_map dma_map;
  char buf [512];
  undefined8 local_238;
  void *local_230;
  void *local_228;
  ulong local_220;
  undefined1 local_218 [520];
  
  local_238 = 0x300000020;
  local_220 = (ulong)size;
  if ((long)(ulong)size < MIN_DMA_MEMORY) {
    local_220 = MIN_DMA_MEMORY;
  }
  local_230 = vaddr;
  local_228 = vaddr;
  iVar1 = get_vfio_container();
  iVar1 = ioctl(iVar1,0x3b71,&local_238);
  if (iVar1 != -1) {
    return (uint64_t)vaddr;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  __xpg_strerror_r(iVar1,local_218,0x200);
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x134
          ,"vfio_map_dma","IOMMU Map DMA Memory",local_218);
  exit(iVar1);
}

Assistant:

uint64_t vfio_map_dma(void* vaddr, uint32_t size) {
	uint64_t iova = (uint64_t) vaddr; // map iova to process virtual address
	struct vfio_iommu_type1_dma_map dma_map = {
		.vaddr = (uint64_t) vaddr,
		.iova = iova,
		.size = size < MIN_DMA_MEMORY ? MIN_DMA_MEMORY : size,
		.argsz = sizeof(dma_map),
		.flags = VFIO_DMA_MAP_FLAG_READ | VFIO_DMA_MAP_FLAG_WRITE};
	int cfd = get_vfio_container();
	check_err(ioctl(cfd, VFIO_IOMMU_MAP_DMA, &dma_map), "IOMMU Map DMA Memory");
	return iova;
}